

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O0

uint32 __thiscall
Protocol::MQTT::V5::FixedField<(Protocol::MQTT::Common::ControlPacketType)3>::copyInto
          (FixedField<(Protocol::MQTT::Common::ControlPacketType)3> *this,uint8 *buffer)

{
  bool bVar1;
  uint16 uVar2;
  uint32 local_1c;
  uint16 p;
  uint32 o;
  uint8 *buffer_local;
  FixedField<(Protocol::MQTT::Common::ControlPacketType)3> *this_local;
  
  local_1c = Common::DynamicString::copyInto(&(this->super_TopicAndID).topicName,buffer);
  bVar1 = hasPacketID(this);
  if (bVar1) {
    uVar2 = BigEndian((this->super_TopicAndID).packetID);
    *(uint16 *)(buffer + local_1c) = uVar2;
    local_1c = local_1c + 2;
  }
  return local_1c;
}

Assistant:

uint32 copyInto(uint8 * buffer) const
                {
                    uint32 o = topicName.copyInto(buffer);
                    if (hasPacketID())
                    {
                        uint16 p = BigEndian(packetID);
                        memcpy(buffer + o, &p, sizeof(p)); o += sizeof(p);
                    }
                    return o;
                }